

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.hpp
# Opt level: O0

void __thiscall
boost::xpressive::detail::
list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::swap(list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *this,list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *that)

{
  int in_ECX;
  list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RSI;
  list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_RDI;
  __off64_t *in_R8;
  size_t in_R9;
  list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  temp;
  uint in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  undefined1 local_48 [8];
  undefined1 local_40 [24];
  undefined1 local_28 [8];
  list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_20;
  list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_10;
  
  local_10 = in_RSI;
  list(&local_20);
  begin((list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  splice(&local_20,(int)local_28,(__off64_t *)local_10,in_ECX,in_R8,in_R9,in_stack_ffffffffffffff98)
  ;
  begin((list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  splice(local_10,(int)local_40,(__off64_t *)in_RDI,in_ECX,in_R8,in_R9,in_stack_ffffffffffffff98);
  begin((list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  splice(in_RDI,(int)local_48,(__off64_t *)&local_20,in_ECX,in_R8,in_R9,in_stack_ffffffffffffff98);
  ~list((list<boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x16b81b);
  return;
}

Assistant:

void swap(list &that) // throw()
        {
            list temp;
            temp.splice(temp.begin(), that);  // move that to temp
            that.splice(that.begin(), *this); // move this to that
            splice(begin(), temp);            // move temp to this
        }